

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

void __thiscall
Js::JavascriptPromiseReaction::MarkVisitPtrs
          (JavascriptPromiseReaction *this,SnapshotExtractor *extractor)

{
  RecyclableObject *var;
  
  var = (this->handler).ptr;
  if ((var != (RecyclableObject *)0x0) &&
     ((this->capabilities).ptr != (JavascriptPromiseCapability *)0x0)) {
    TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
    JavascriptPromiseCapability::MarkVisitPtrs((this->capabilities).ptr,extractor);
    return;
  }
  TTDAbort_unrecoverable_error("Seems odd, I was not expecting this!!!");
}

Assistant:

void JavascriptPromiseReaction::MarkVisitPtrs(TTD::SnapshotExtractor* extractor)
    {
        TTDAssert(this->handler != nullptr && this->capabilities != nullptr, "Seems odd, I was not expecting this!!!");

        extractor->MarkVisitVar(this->handler);

        this->capabilities->MarkVisitPtrs(extractor);
    }